

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_destination_atop(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint32_t uVar1;
  uint32_t a;
  uint32_t d_1;
  uint32_t s_1;
  int i_1;
  uint32_t cia;
  uint32_t d;
  uint32_t s;
  int i;
  uint32_t const_alpha_local;
  uint32_t *src_local;
  int length_local;
  uint32_t *dest_local;
  
  if (const_alpha == 0xff) {
    for (d = 0; (int)d < length; d = d + 1) {
      uVar1 = INTERPOLATE_PIXEL(dest[(int)d],src[(int)d] >> 0x18,src[(int)d],
                                (dest[(int)d] ^ 0xffffffff) >> 0x18);
      dest[(int)d] = uVar1;
    }
  }
  else {
    for (d_1 = 0; (int)d_1 < length; d_1 = d_1 + 1) {
      uVar1 = BYTE_MUL(src[(int)d_1],const_alpha);
      uVar1 = INTERPOLATE_PIXEL(dest[(int)d_1],(uVar1 >> 0x18) + (0xff - const_alpha),uVar1,
                                (dest[(int)d_1] ^ 0xffffffff) >> 0x18);
      dest[(int)d_1] = uVar1;
    }
  }
  return;
}

Assistant:

static void composition_destination_atop(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            uint32_t s = src[i];
            uint32_t d = dest[i];
            dest[i] = INTERPOLATE_PIXEL(d, plutovg_alpha(s), s, plutovg_alpha(~d));
        }
    } else {
        uint32_t cia = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            uint32_t d = dest[i];
            uint32_t a = plutovg_alpha(s) + cia;
            dest[i] = INTERPOLATE_PIXEL(d, a, s, plutovg_alpha(~d));
        }
    }
}